

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCast>>
               (interval_t *ldata,string_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  ulong *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  sel_t *psVar5;
  undefined4 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined4 uVar7;
  byte bVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ulong uVar11;
  undefined8 uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  char **ppcVar15;
  string_t sVar16;
  interval_t input;
  interval_t input_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  ValidityMask *local_40;
  idx_t local_38;
  
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar5 = sel_vector->sel_vector;
      ppcVar15 = &(result_data->value).pointer.ptr;
      uVar14 = 0;
      do {
        uVar11 = uVar14;
        if (psVar5 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar5[uVar14];
        }
        uVar4 = ldata[uVar11].months;
        uVar7 = ldata[uVar11].days;
        input_00.days = uVar7;
        input_00.months = uVar4;
        input_00.micros = ldata[uVar11].micros;
        sVar16 = StringCast::Operation<duckdb::interval_t>(input_00,(Vector *)dataptr);
        uVar12 = sVar16.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar15 + -1);
        paVar1->length = (int)uVar12;
        paVar1->prefix[0] = (char)((ulong)uVar12 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar12 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar12 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar12 >> 0x38);
        *ppcVar15 = sVar16.value._8_8_;
        uVar14 = uVar14 + 1;
        ppcVar15 = ppcVar15 + 2;
      } while (count != uVar14);
    }
  }
  else if (count != 0) {
    psVar5 = sel_vector->sel_vector;
    local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    ppcVar15 = &(result_data->value).pointer.ptr;
    uVar14 = 0;
    do {
      uVar11 = uVar14;
      if (psVar5 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar5[uVar14];
      }
      if (((local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar11 >> 6] >>
           (uVar11 & 0x3f) & 1) == 0) {
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var10 = p_Stack_50;
          peVar9 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar9;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var10;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar8 = (byte)uVar14 & 0x3f;
        puVar2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar14 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      }
      else {
        uVar3 = ldata[uVar11].months;
        uVar6 = ldata[uVar11].days;
        input.days = uVar6;
        input.months = uVar3;
        input.micros = ldata[uVar11].micros;
        sVar16 = StringCast::Operation<duckdb::interval_t>(input,(Vector *)dataptr);
        uVar12 = sVar16.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar15 + -1);
        paVar1->length = (int)uVar12;
        paVar1->prefix[0] = (char)((ulong)uVar12 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar12 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar12 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar12 >> 0x38);
        *ppcVar15 = sVar16.value._8_8_;
      }
      uVar14 = uVar14 + 1;
      ppcVar15 = ppcVar15 + 2;
    } while (count != uVar14);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}